

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallFilesGenerator::GenerateScriptForConfig
          (cmInstallFilesGenerator *this,ostream *os,string *config,Indent *indent)

{
  Snapshot snapshot;
  char *pcVar1;
  pointer pbVar2;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  cmGeneratorExpression ge;
  allocator local_141;
  auto_ptr<cmCompiledGeneratorExpression> local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  ostream *local_120;
  Indent *local_118;
  cmCommandContext local_110;
  string local_e8;
  Snapshot local_c8;
  cmListFileBacktrace local_b0;
  cmGeneratorExpression local_70;
  
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_138.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120 = os;
  local_118 = indent;
  cmState::Snapshot::Snapshot(&local_c8,(cmState *)0x0);
  local_110.Name._M_dataplus._M_p = (pointer)&local_110.Name.field_2;
  local_110.Name._M_string_length = 0;
  local_110.Name.field_2._M_local_buf[0] = '\0';
  local_110.Line = 0;
  snapshot.Position.Tree = local_c8.Position.Tree;
  snapshot.State = local_c8.State;
  snapshot.Position.Position = local_c8.Position.Position;
  cmListFileBacktrace::cmListFileBacktrace(&local_b0,snapshot,&local_110);
  cmGeneratorExpression::cmGeneratorExpression(&local_70,&local_b0);
  cmListFileBacktrace::~cmListFileBacktrace(&local_b0);
  std::__cxx11::string::~string((string *)&local_110);
  for (pbVar2 = (this->Files).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != (this->Files).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&local_b0,(string *)&local_70);
    local_140.x_ = (cmCompiledGeneratorExpression *)local_b0.Context.Name._M_dataplus._M_p;
    local_b0.Context.Name._M_dataplus._M_p = (pointer)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_b0);
    local_110.Name._M_dataplus._M_p = (pointer)&local_110.Name.field_2;
    local_110.Name._M_string_length = 0;
    local_110.Name.field_2._M_local_buf[0] = '\0';
    pcVar1 = cmCompiledGeneratorExpression::Evaluate
                       (local_140.x_,this->LocalGenerator,config,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        &local_110.Name);
    std::__cxx11::string::string((string *)&local_b0,pcVar1,&local_141);
    cmSystemTools::ExpandListArgument((string *)&local_b0,&local_138,false);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_110);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_140);
  }
  std::__cxx11::string::string((string *)&local_e8,(string *)config);
  AddFilesInstallRule(this,local_120,&local_e8,local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_e8);
  cmGeneratorExpression::~cmGeneratorExpression(&local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  return;
}

Assistant:

void cmInstallFilesGenerator::GenerateScriptForConfig(std::ostream& os,
                                                    const std::string& config,
                                                    Indent const& indent)
{
  std::vector<std::string> files;
  cmGeneratorExpression ge;
  for(std::vector<std::string>::const_iterator i = this->Files.begin();
      i != this->Files.end(); ++i)
    {
    cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(*i);
    cmSystemTools::ExpandListArgument(cge->Evaluate(
        this->LocalGenerator, config), files);
    }
  this->AddFilesInstallRule(os, config, indent, files);
}